

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86.cpp
# Opt level: O0

int __thiscall ncnn::InnerProduct_x86::create_pipeline_int8_x86(InnerProduct_x86 *this,Option *opt)

{
  int iVar1;
  int iVar2;
  Layer *pLVar3;
  char *pcVar4;
  long in_RSI;
  long *in_RDI;
  Option *in_stack_00000010;
  Mat *in_stack_00000018;
  int in_stack_00000024;
  int j;
  int p;
  char *g0;
  int q;
  Mat weight_data_r2;
  int out_elempack;
  int num_input;
  Allocator *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  size_t _elemsize;
  undefined4 in_stack_ffffffffffffff80;
  int iVar5;
  undefined4 in_stack_ffffffffffffff84;
  int iVar6;
  char *local_78;
  int local_70;
  Allocator *in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  Mat *in_stack_ffffffffffffffa8;
  int local_18;
  
  iVar6 = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  pLVar3 = create_activation_layer(in_stack_00000024,in_stack_00000018,in_stack_00000010);
  in_RDI[2] = (long)pLVar3;
  iVar1 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
  iVar2 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
  local_18 = 1;
  if (((*(byte *)(in_RSI + 0x27) & 1) != 0) &&
     (local_18 = 1, *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) % 8 == 0)) {
    local_18 = 8;
  }
  _elemsize = 0;
  ncnn::Mat::reshape(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0,
                     in_stack_ffffffffffffff98);
  ncnn::Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                    (int)((ulong)in_RDI >> 0x20),(int)in_RDI,_elemsize,iVar6,
                    in_stack_ffffffffffffff60);
  for (local_70 = 0;
      local_70 + local_18 + -1 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
      local_70 = local_18 + local_70) {
    local_78 = ncnn::Mat::row<signed_char>((Mat *)(in_RDI + 0x15),local_70 / local_18);
    for (iVar6 = 0; iVar6 < iVar1 / iVar2; iVar6 = iVar6 + 1) {
      for (iVar5 = 0; iVar5 < local_18; iVar5 = iVar5 + 1) {
        pcVar4 = ncnn::Mat::row<signed_char>((Mat *)&stack0xffffffffffffffa0,local_70 + iVar5);
        *local_78 = pcVar4[iVar6];
        local_78 = local_78 + 1;
      }
    }
  }
  ncnn::Mat::~Mat((Mat *)0x395621);
  return 0;
}

Assistant:

int InnerProduct_x86::create_pipeline_int8_x86(const Option& opt)
{
    activation = create_activation_layer(activation_type, activation_params, opt);

    const int num_input = weight_data_size / num_output;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        out_elempack = num_output % 8 == 0 ? 8 : 1;
    }
#endif // __SSE2__

    // src = inch-outch
    // dst = pb-inch-outch/pb
    {
        Mat weight_data_r2 = weight_data.reshape(num_input, num_output);

        weight_data_int8.create(num_input, num_output / out_elempack, (size_t)out_elempack, out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            signed char* g0 = weight_data_int8.row<signed char>(q / out_elempack);

            for (int p = 0; p < num_input; p++)
            {
                for (int j = 0; j < out_elempack; j++)
                {
                    *g0++ = weight_data_r2.row<signed char>(q + j)[p];
                }
            }
        }
    }

    return 0;
}